

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O2

void server_handle_write(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_error cVar1;
  char *__ptr;
  size_t sStack_10;
  
  if (err == CIO_SUCCESS) {
    *(long *)((long)handler_context + 0x1d8) =
         *(long *)((long)handler_context + 0x1d8) + *handler_context;
    cVar1 = cio_buffered_stream_read_at_least
                      (buffered_stream,(cio_read_buffer *)((long)handler_context + 0x1c0),6,
                       server_handle_read,handler_context);
    if (cVar1 == CIO_SUCCESS) {
      return;
    }
    __ptr = "server could no start reading!\n";
    sStack_10 = 0x1f;
  }
  else {
    __ptr = "server failed to write!\n";
    sStack_10 = 0x18;
  }
  fwrite(__ptr,sStack_10,1,_stderr);
  return;
}

Assistant:

static void server_handle_write(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	struct echo_client *client = handler_context;

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server failed to write!\n");
		return;
	}

	cio_read_buffer_consume(&client->rb, client->bytes_read);

	err = cio_buffered_stream_read_at_least(buffered_stream, &client->rb, sizeof(HELLO), server_handle_read, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server could no start reading!\n");
		return;
	}
}